

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::EntryPointInfo::DumpNativeThrowSpanSequence(EntryPointInfo *this)

{
  int iVar1;
  int iVar2;
  uint32 uVar3;
  BOOL BVar4;
  NativeEntryPointData *this_00;
  SmallSpanSequence *this_01;
  DWORD_PTR DVar5;
  ptrdiff_t pVar6;
  long lVar7;
  StatementData local_38;
  StatementData data;
  int i;
  SmallSpanSequenceIter iter;
  int count;
  SmallSpanSequence *nativeThrowSpanSequence;
  EntryPointInfo *this_local;
  
  this_00 = GetNativeEntryPointData(this);
  this_01 = NativeEntryPointData::GetNativeThrowSpanSequence(this_00);
  if (this_01 != (SmallSpanSequence *)0x0) {
    DVar5 = GetNativeAddress(this);
    pVar6 = GetCodeSize(this);
    Output::Print(L"Native Throw Map: baseAddr: 0x%0Ix, size: 0x%Ix\nstatementId, offset range, address range\n"
                  ,DVar5,pVar6);
    uVar3 = SmallSpanSequence::Count(this_01);
    SmallSpanSequenceIter::SmallSpanSequenceIter((SmallSpanSequenceIter *)&data.bytecodeBegin);
    for (data.sourceBegin = 0; data.sourceBegin < (int)uVar3;
        data.sourceBegin = data.sourceBegin + 1) {
      StatementData::StatementData(&local_38);
      BVar4 = SmallSpanSequence::Item
                        (this_01,data.sourceBegin,(SmallSpanSequenceIter *)&data.bytecodeBegin,
                         &local_38);
      iVar2 = local_38.bytecodeBegin;
      iVar1 = local_38.sourceBegin;
      if (BVar4 != 0) {
        lVar7 = (long)local_38.bytecodeBegin;
        DVar5 = GetNativeAddress(this);
        Output::Print(L"S%4d, (%5d -----)  (0x%012Ix --------)\n",(ulong)(uint)iVar1,
                      (ulong)(uint)iVar2,lVar7 + DVar5);
      }
    }
  }
  return;
}

Assistant:

void EntryPointInfo::DumpNativeThrowSpanSequence()
    {
        // Native Throw Map
        SmallSpanSequence * nativeThrowSpanSequence = this->GetNativeEntryPointData()->GetNativeThrowSpanSequence();
        if (nativeThrowSpanSequence)
        {
            Output::Print(_u("Native Throw Map: baseAddr: 0x%0Ix, size: 0x%Ix\nstatementId, offset range, address range\n"),
                          this->GetNativeAddress(),
                          this->GetCodeSize());

            int count = nativeThrowSpanSequence->Count();
            SmallSpanSequenceIter iter;
            for (int i = 0; i < count; i++)
            {
                StatementData data;
                if (nativeThrowSpanSequence->Item(i, iter, data))
                {
                    Output::Print(_u("S%4d, (%5d -----)  (0x%012Ix --------)\n"), data.sourceBegin, // statementIndex
                        data.bytecodeBegin, // nativeOffset
                        data.bytecodeBegin + this->GetNativeAddress());
                }
            }
        }
    }